

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
::parallel_hash_set(parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                    *this,parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                          *that,allocator_type *a)

{
  reference pvVar1;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_70;
  ulong local_28;
  size_t i;
  allocator_type *a_local;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  *that_local;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  *this_local;
  
  i = (size_t)a;
  a_local = (allocator_type *)that;
  that_local = this;
  std::
  array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::Inner,_16UL>
  ::array(&this->sets_);
  for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 1) {
    pvVar1 = std::
             array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::Inner,_16UL>
             ::operator[]((array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::Inner,_16UL>
                           *)a_local,local_28);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
    ::raw_hash_set(&local_70,&pvVar1->set_,(allocator_type *)i);
    pvVar1 = std::
             array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::Inner,_16UL>
             ::operator[](&this->sets_,local_28);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
    ::operator=(&pvVar1->set_,&local_70);
    raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
    ::~raw_hash_set(&local_70);
  }
  return;
}

Assistant:

parallel_hash_set(parallel_hash_set&& that, const allocator_type& a)
    {
        for (size_t i=0; i<num_tables; ++i)
            sets_[i].set_ = { std::move(that.sets_[i]).set_, a };
    }